

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::WriteDescriptorSet
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
  __last;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference ppFVar5;
  char *pcVar6;
  int *piVar7;
  ostream *poVar8;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *in_RSI;
  long in_RDI;
  FileOutputStream out;
  int fd;
  int i_2;
  FileDescriptor *dependency;
  int i_1;
  FileDescriptor *file;
  int i;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  to_output;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  FileDescriptorSet file_set;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *in_stack_fffffffffffffde8;
  FileOutputStream *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
  in_stack_fffffffffffffe00;
  value_type *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined8 in_stack_fffffffffffffe28;
  FileDescriptor *in_stack_fffffffffffffe30;
  FileDescriptor *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  int local_104;
  _Self local_f0;
  _Self local_e8;
  FileDescriptor *local_e0;
  int local_d4;
  FileDescriptor *local_d0;
  int local_c8;
  FileDescriptor **local_b8;
  FileDescriptor **local_b0;
  FileDescriptorSet local_48;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  FileDescriptorSet::FileDescriptorSet
            ((FileDescriptorSet *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         *)0x415c61);
  if ((*(byte *)(in_RDI + 0x278) & 1) == 0) {
    std::
    set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           *)0x415c8b);
    local_b0 = (FileDescriptor **)
               std::
               vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ::begin((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        *)in_stack_fffffffffffffde8);
    local_b8 = (FileDescriptor **)
               std::
               vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ::end((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      *)in_stack_fffffffffffffde8);
    __last._M_current._4_4_ = in_stack_fffffffffffffdfc;
    __last._M_current._0_4_ = in_stack_fffffffffffffdf8;
    std::
    set<google::protobuf::FileDescriptor_const*,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
    ::
    insert<__gnu_cxx::__normal_iterator<google::protobuf::FileDescriptor_const*const*,std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>>>
              ((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffe00,__last);
    for (local_c8 = 0; uVar3 = (ulong)local_c8,
        sVar4 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::size(local_18), uVar3 < sVar4; local_c8 = local_c8 + 1) {
      ppFVar5 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::operator[](local_18,(long)local_c8);
      local_d0 = *ppFVar5;
      local_d4 = 0;
      while (in_stack_fffffffffffffe80 = local_d4,
            in_stack_fffffffffffffe84 = FileDescriptor::dependency_count(local_d0),
            in_stack_fffffffffffffe80 < in_stack_fffffffffffffe84) {
        in_stack_fffffffffffffe78 =
             FileDescriptor::dependency
                       ((FileDescriptor *)in_stack_fffffffffffffe00._M_current,
                        in_stack_fffffffffffffdfc);
        local_e0 = in_stack_fffffffffffffe78;
        local_e8._M_node =
             (_Base_ptr)
             std::
             set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::find((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                    (key_type *)in_stack_fffffffffffffdf0);
        local_f0._M_node =
             (_Base_ptr)
             std::
             set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::end(in_stack_fffffffffffffde8);
        bVar1 = std::operator==(&local_e8,&local_f0);
        if (bVar1) {
          std::
          set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::insert((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                   in_stack_fffffffffffffe08);
        }
        local_d4 = local_d4 + 1;
      }
    }
    std::
    set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            *)0x415ea5);
  }
  for (local_104 = 0;
      sVar4 = std::
              vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::size(local_18), (ulong)(long)local_104 < sVar4; local_104 = local_104 + 1) {
    std::
    vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::operator[](local_18,(long)local_104);
    FileDescriptorSet::mutable_file(&local_48);
    GetTransitiveDependencies
              (in_stack_fffffffffffffe30,SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffffe28 >> 0x30,0),
               (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe18);
  }
  do {
    pcVar6 = (char *)std::__cxx11::string::c_str();
    iVar2 = open(pcVar6,0x241,0x1b6);
    bVar1 = false;
    if (iVar2 < 0) {
      piVar7 = __errno_location();
      bVar1 = *piVar7 == 4;
    }
  } while (bVar1);
  if (iVar2 < 0) {
    pcVar6 = (char *)std::__cxx11::string::c_str();
    perror(pcVar6);
    local_1 = 0;
  }
  else {
    io::FileOutputStream::FileOutputStream
              ((FileOutputStream *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
               (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),(int)in_stack_fffffffffffffe08);
    bVar1 = MessageLite::SerializeToZeroCopyStream
                      ((MessageLite *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       (ZeroCopyOutputStream *)in_stack_fffffffffffffe78);
    if (bVar1) {
      bVar1 = io::FileOutputStream::Close(in_stack_fffffffffffffdf0);
      if (bVar1) {
        local_1 = 1;
      }
      else {
        poVar8 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 0x238));
        poVar8 = std::operator<<(poVar8,": ");
        iVar2 = io::FileOutputStream::GetErrno((FileOutputStream *)0x416192);
        pcVar6 = strerror(iVar2);
        in_stack_fffffffffffffdf0 = (FileOutputStream *)std::operator<<(poVar8,pcVar6);
        std::ostream::operator<<(in_stack_fffffffffffffdf0,std::endl<char,std::char_traits<char>>);
        local_1 = 0;
      }
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 0x238));
      poVar8 = std::operator<<(poVar8,": ");
      iVar2 = io::FileOutputStream::GetErrno((FileOutputStream *)0x4160a7);
      pcVar6 = strerror(iVar2);
      poVar8 = std::operator<<(poVar8,pcVar6);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      io::FileOutputStream::Close(in_stack_fffffffffffffdf0);
      local_1 = 0;
    }
    io::FileOutputStream::~FileOutputStream(in_stack_fffffffffffffdf0);
  }
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *)0x41620a);
  FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)in_stack_fffffffffffffdf0);
  return (bool)(local_1 & 1);
}

Assistant:

bool CommandLineInterface::WriteDescriptorSet(
    const std::vector<const FileDescriptor*>& parsed_files) {
  FileDescriptorSet file_set;

  std::set<const FileDescriptor*> already_seen;
  if (!imports_in_descriptor_set_) {
    // Since we don't want to output transitive dependencies, but we do want
    // things to be in dependency order, add all dependencies that aren't in
    // parsed_files to already_seen.  This will short circuit the recursion
    // in GetTransitiveDependencies.
    std::set<const FileDescriptor*> to_output;
    to_output.insert(parsed_files.begin(), parsed_files.end());
    for (int i = 0; i < parsed_files.size(); i++) {
      const FileDescriptor* file = parsed_files[i];
      for (int i = 0; i < file->dependency_count(); i++) {
        const FileDescriptor* dependency = file->dependency(i);
        // if the dependency isn't in parsed files, mark it as already seen
        if (to_output.find(dependency) == to_output.end()) {
          already_seen.insert(dependency);
        }
      }
    }
  }
  for (int i = 0; i < parsed_files.size(); i++) {
    GetTransitiveDependencies(parsed_files[i],
                              true,  // Include json_name
                              source_info_in_descriptor_set_, &already_seen,
                              file_set.mutable_file());
  }

  int fd;
  do {
    fd = open(descriptor_set_out_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(descriptor_set_out_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);
  if (!file_set.SerializeToZeroCopyStream(&out)) {
    std::cerr << descriptor_set_out_name_ << ": " << strerror(out.GetErrno())
              << std::endl;
    out.Close();
    return false;
  }
  if (!out.Close()) {
    std::cerr << descriptor_set_out_name_ << ": " << strerror(out.GetErrno())
              << std::endl;
    return false;
  }

  return true;
}